

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void ncnn::cast_int8_to_float32(Mat *src,Mat *dst,Option *opt)

{
  Layer *pLVar1;
  ParamDict pd;
  ParamDict PStack_38;
  
  pLVar1 = create_layer(0x40);
  ParamDict::ParamDict(&PStack_38);
  ParamDict::set(&PStack_38,0,3);
  ParamDict::set(&PStack_38,1,1);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&PStack_38);
  (*pLVar1->_vptr_Layer[4])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[7])(pLVar1,src,dst,opt);
  (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  ParamDict::~ParamDict(&PStack_38);
  return;
}

Assistant:

void cast_int8_to_float32(const Mat& src, Mat& dst, const Option& opt)
{
    Layer* cast = create_layer(LayerType::Cast);

    ParamDict pd;
    pd.set(0, 3);
    pd.set(1, 1);

    cast->load_param(pd);

    cast->create_pipeline(opt);

    cast->forward(src, dst, opt);

    cast->destroy_pipeline(opt);

    delete cast;
}